

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

void * get_component(ecs_entity_info_t *info,ecs_entity_t component)

{
  short sVar1;
  short sVar2;
  ecs_vector_t *peVar3;
  ecs_data_t *peVar4;
  ecs_column_t *peVar5;
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  int16_t offset;
  char *__function;
  ulong uVar9;
  char *__assertion;
  long lVar10;
  
  _ecs_assert(info->table != (ecs_table_t *)0x0,0xc,(char *)0x0,"info->table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x35);
  if (info->table == (ecs_table_t *)0x0) {
    __assertion = "info->table != ((void*)0)";
    __function = "void *get_component(ecs_entity_info_t *, ecs_entity_t)";
    uVar6 = 0x35;
  }
  else {
    _ecs_assert(component != 0,0xc,(char *)0x0,"component != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x36);
    if (component == 0) {
      __assertion = "component != 0";
      __function = "void *get_component(ecs_entity_info_t *, ecs_entity_t)";
      uVar6 = 0x36;
    }
    else {
      _ecs_assert((_Bool)((byte)~(byte)((uint)info->row >> 0x18) >> 7),0xc,(char *)0x0,
                  "info->row >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x37);
      if (info->row < 0) {
        __assertion = "info->row >= 0";
        __function = "void *get_component(ecs_entity_info_t *, ecs_entity_t)";
        uVar6 = 0x37;
      }
      else {
        peVar3 = info->table->type;
        pvVar7 = _ecs_vector_first(peVar3,8,0x10);
        uVar6 = ecs_vector_count(peVar3);
        uVar8 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar8 = 0;
        }
        lVar10 = 10;
        uVar9 = 0;
        while( true ) {
          if (uVar8 == uVar9) {
            return (void *)0x0;
          }
          if (*(ecs_entity_t *)((long)pvVar7 + uVar9 * 8) == component) break;
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 0x10;
        }
        peVar4 = info->data;
        _ecs_assert(peVar4 != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x13);
        if (peVar4 == (ecs_data_t *)0x0) {
          __assertion = "data != ((void*)0)";
          __function = "void *get_component_w_index(ecs_entity_info_t *, int32_t)";
          uVar6 = 0x13;
        }
        else {
          peVar5 = peVar4->columns;
          _ecs_assert(peVar5 != (ecs_column_t *)0x0,0xc,(char *)0x0,"columns != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x16);
          if (peVar5 == (ecs_column_t *)0x0) {
            __assertion = "columns != ((void*)0)";
            __function = "void *get_component_w_index(ecs_entity_info_t *, int32_t)";
            uVar6 = 0x16;
          }
          else {
            _ecs_assert((int)uVar9 < info->table->column_count,3,(char *)0x0,
                        "index < info->table->column_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x17);
            if ((int)uVar9 < info->table->column_count) {
              peVar3 = *(ecs_vector_t **)((long)peVar5 + lVar10 + -10);
              sVar1 = *(short *)((long)peVar5 + lVar10 + -2);
              _ecs_assert(sVar1 != 0,2,(char *)0x0,"size != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                          ,0x1f);
              if (sVar1 == 0) {
                __assertion = "size != 0";
                __function = "void *get_component_w_index(ecs_entity_info_t *, int32_t)";
                uVar6 = 0x1f;
              }
              else {
                _ecs_assert(peVar3 != (ecs_vector_t *)0x0,0xc,(char *)0x0,"data_vec != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                            ,0x24);
                if (peVar3 == (ecs_vector_t *)0x0) {
                  __assertion = "data_vec != ((void*)0)";
                  __function = "void *get_component_w_index(ecs_entity_info_t *, int32_t)";
                  uVar6 = 0x24;
                }
                else {
                  sVar2 = *(short *)((long)&peVar5->data + lVar10);
                  offset = 0x10;
                  if (0x10 < sVar2) {
                    offset = sVar2;
                  }
                  pvVar7 = _ecs_vector_first(peVar3,(int)sVar1,offset);
                  _ecs_assert(pvVar7 != (void *)0x0,0xc,(char *)0x0,"ptr != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                              ,0x2a);
                  if (pvVar7 != (void *)0x0) {
                    return (void *)((long)(int)sVar1 * (long)info->row + (long)pvVar7);
                  }
                  __assertion = "ptr != ((void*)0)";
                  __function = "void *get_component_w_index(ecs_entity_info_t *, int32_t)";
                  uVar6 = 0x2a;
                }
              }
            }
            else {
              __assertion = "index < info->table->column_count";
              __function = "void *get_component_w_index(ecs_entity_info_t *, int32_t)";
              uVar6 = 0x17;
            }
          }
        }
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,uVar6,__function);
}

Assistant:

static
void* get_component(
    ecs_entity_info_t *info,
    ecs_entity_t component)
{
    ecs_assert(info->table != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(component != 0, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(info->row >= 0, ECS_INTERNAL_ERROR, NULL);

    ecs_table_t *table = info->table;
    ecs_type_t type = table->type;

    ecs_entity_t *ids = ecs_vector_first(type, ecs_entity_t);

    /* The table column_count contains the maximum column index that actually
     * contains data. This excludes component ids that do not have data, such
     * as tags. Therefore it is faster to iterate column_count vs. all the
     * elements in the type.
     *
     * The downside of this is that the code can't always detect when an 
     * application attempts to get the value of a tag (which is not allowed). To
     * ensure consistent behavior in debug mode, the entire type is iterated as
     * this guarantees that the code will assert when attempting to obtain the
     * value of a tag. */
#ifndef NDEBUG
    int i, count = ecs_vector_count(type);
#else
    int i, count = table->column_count;
#endif

    for (i = 0; i < count; i ++) {
        if (ids[i] == component) {
            return get_component_w_index(info, i);
        }
    }

    return NULL;
}